

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Plan::CleanNode(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  string *err_00;
  bool bVar2;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var3;
  _Base_ptr p_Var4;
  Node *most_recent_input;
  Node **ppNVar5;
  pointer ppNVar6;
  iterator i;
  Node **ppNVar7;
  Edge *pEVar8;
  _Base_ptr p_Var9;
  pointer ppEVar10;
  bool outputs_dirty;
  bool local_49;
  Node *local_48;
  DependencyScan *local_40;
  string *local_38;
  
  node->dirty_ = false;
  ppEVar10 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppEVar10 !=
      (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    local_48 = node;
    local_40 = scan;
    local_38 = err;
    do {
      p_Var4 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Base_ptr)0x0) {
        pEVar8 = *ppEVar10;
        p_Var9 = &p_Var1->_M_header;
        do {
          if (*(Edge **)(p_Var4 + 1) >= pEVar8) {
            p_Var9 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(Edge **)(p_Var4 + 1) < pEVar8];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((((_Rb_tree_header *)p_Var9 != p_Var1) &&
             ((Edge *)((_Rb_tree_header *)p_Var9)->_M_node_count <= pEVar8)) &&
            (*(int *)((long)p_Var9 + 0x28) != 0)) && (pEVar8->deps_missing_ == false)) {
          ppNVar7 = (pEVar8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppNVar5 = (pEVar8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish + -(long)pEVar8->order_only_deps_;
          _Var3 = std::
                  __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<std::_Mem_fn<bool(Node::*)()const>>>
                            (ppNVar7,ppNVar5,Node::dirty,0);
          err_00 = local_38;
          node = local_48;
          if (_Var3._M_current == ppNVar5) {
            most_recent_input = (Node *)0x0;
            for (; ppNVar7 != ppNVar5; ppNVar7 = ppNVar7 + 1) {
              if ((most_recent_input == (Node *)0x0) ||
                 (most_recent_input->mtime_ < (*ppNVar7)->mtime_)) {
                most_recent_input = *ppNVar7;
              }
            }
            local_49 = false;
            bVar2 = DependencyScan::RecomputeOutputsDirty
                              (local_40,*ppEVar10,most_recent_input,&local_49,local_38);
            if (!bVar2) {
              return false;
            }
            node = local_48;
            if (local_49 == false) {
              pEVar8 = *ppEVar10;
              for (ppNVar6 = (pEVar8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  ppNVar6 !=
                  (pEVar8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish; ppNVar6 = ppNVar6 + 1) {
                bVar2 = CleanNode(this,local_40,*ppNVar6,err_00);
                if (!bVar2) {
                  return false;
                }
                pEVar8 = *ppEVar10;
              }
              *(undefined4 *)((long)p_Var9 + 0x28) = 0;
              this->wanted_edges_ = this->wanted_edges_ + -1;
              bVar2 = Edge::is_phony(pEVar8);
              node = local_48;
              if (!bVar2) {
                this->command_edges_ = this->command_edges_ + -1;
              }
            }
          }
        }
      }
      ppEVar10 = ppEVar10 + 1;
    } while (ppEVar10 !=
             (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return true;
}

Assistant:

bool Plan::CleanNode(DependencyScan* scan, Node* node, string* err) {
  node->set_dirty(false);

  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    // Don't process edges that we don't actually want.
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end() || want_e->second == kWantNothing)
      continue;

    // Don't attempt to clean an edge if it failed to load deps.
    if ((*oe)->deps_missing_)
      continue;

    // If all non-order-only inputs for this edge are now clean,
    // we might have changed the dirty state of the outputs.
    vector<Node*>::iterator
        begin = (*oe)->inputs_.begin(),
        end = (*oe)->inputs_.end() - (*oe)->order_only_deps_;
#if __cplusplus < 201703L
#define MEM_FN mem_fun
#else
#define MEM_FN mem_fn  // mem_fun was removed in C++17.
#endif
    if (find_if(begin, end, MEM_FN(&Node::dirty)) == end) {
      // Recompute most_recent_input.
      Node* most_recent_input = NULL;
      for (vector<Node*>::iterator i = begin; i != end; ++i) {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime())
          most_recent_input = *i;
      }

      // Now, this edge is dirty if any of the outputs are dirty.
      // If the edge isn't dirty, clean the outputs and mark the edge as not
      // wanted.
      bool outputs_dirty = false;
      if (!scan->RecomputeOutputsDirty(*oe, most_recent_input,
                                       &outputs_dirty, err)) {
        return false;
      }
      if (!outputs_dirty) {
        for (vector<Node*>::iterator o = (*oe)->outputs_.begin();
             o != (*oe)->outputs_.end(); ++o) {
          if (!CleanNode(scan, *o, err))
            return false;
        }

        want_e->second = kWantNothing;
        --wanted_edges_;
        if (!(*oe)->is_phony())
          --command_edges_;
      }
    }
  }
  return true;
}